

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Vector<kj::Promise<void>_>::~Vector(Vector<kj::Promise<void>_> *this)

{
  Promise<void> *pPVar1;
  RemoveConst<kj::Promise<void>_> *pRVar2;
  Promise<void> *pPVar3;
  ArrayDisposer *pAVar4;
  
  pPVar1 = (this->builder).ptr;
  if (pPVar1 != (Promise<void> *)0x0) {
    pRVar2 = (this->builder).pos;
    pPVar3 = (this->builder).endPtr;
    (this->builder).ptr = (Promise<void> *)0x0;
    (this->builder).pos = (RemoveConst<kj::Promise<void>_> *)0x0;
    (this->builder).endPtr = (Promise<void> *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pPVar1,0x10,(long)pRVar2 - (long)pPVar1 >> 4,(long)pPVar3 - (long)pPVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Promise<void>,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }